

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::StructTypeInfo::Deserialize(StructTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  StructTypeInfo *pSVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::StructTypeInfo,_true> result;
  
  pSVar2 = (StructTypeInfo *)operator_new(0x50);
  StructTypeInfo(pSVar2);
  ::std::__shared_ptr<duckdb::StructTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::StructTypeInfo,void>
            ((__shared_ptr<duckdb::StructTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,pSVar2);
  pSVar2 = shared_ptr<duckdb::StructTypeInfo,_true>::operator->(&result);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,true>>
            (deserializer,200,"child_types",&pSVar2->child_types);
  _Var1 = result.internal.super___shared_ptr<duckdb::StructTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  result.internal.super___shared_ptr<duckdb::StructTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::StructTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::StructTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.super___shared_ptr<duckdb::StructTypeInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> StructTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<StructTypeInfo>(new StructTypeInfo());
	deserializer.ReadPropertyWithDefault<child_list_t<LogicalType>>(200, "child_types", result->child_types);
	return std::move(result);
}